

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

void env_free(Environment *env)

{
  Record *rec_00;
  Record *pRVar1;
  Record *bak;
  Record *rec;
  Environment *env_local;
  
  while (env->front != (Record *)0x0) {
    rec_00 = env->front;
    pRVar1 = rec_00->next;
    if ((rec_00->object).type == OBJECT_ARRAY) {
      free((rec_00->object).field_1.arr.values);
    }
    else if ((rec_00->object).type == OBJECT_INSTANCE) {
      gc_rec(rec_00);
    }
    free(rec_00);
    env->front = pRVar1;
  }
  free(env);
  return;
}

Assistant:

void env_free(Environment *env){
    while(env->front != NULL){
        Record *rec = env->front;
        Record *bak = rec->next;
        if(rec->object.type == OBJECT_ARRAY)
            memfree(rec->object.arr.values);
        else if(rec->object.type == OBJECT_INSTANCE){
            gc_rec(rec);
        }
        //        memfree(rec->name);
        memfree(rec);
        env->front = bak;
    }
    memfree(env);
}